

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

InterpolationViewer * FindPastViewer(AActor *actor)

{
  uint uVar1;
  InterpolationViewer *pIVar2;
  ulong uVar3;
  InterpolationViewer local_80;
  
  uVar3 = (ulong)PastViewers.Count;
  pIVar2 = PastViewers.Array;
  while( true ) {
    if (uVar3 == 0) {
      local_80.Old.Pos.X = 0.0;
      local_80.New.Angles.Yaw.Degrees = 0.0;
      local_80.New.Angles.Roll.Degrees = 0.0;
      local_80.New.Pos.Z = 0.0;
      local_80.New.Angles.Pitch.Degrees = 0.0;
      local_80.New.Pos.X = 0.0;
      local_80.New.Pos.Y = 0.0;
      local_80.Old.Angles.Roll.Degrees = 0.0;
      local_80.Old.Angles.CamRoll.Degrees = 0.0;
      local_80.Old.Angles.Pitch.Degrees = 0.0;
      local_80.Old.Angles.Yaw.Degrees = 0.0;
      local_80.Old.Pos.Y = 0.0;
      local_80.Old.Pos.Z = 0.0;
      local_80.New.Angles.CamRoll.Degrees = 0.0;
      local_80.otic = -1;
      local_80._12_4_ = 0;
      if (InterpolationPath.Count != 0) {
        InterpolationPath.Count = 0;
      }
      local_80.ViewActor = actor;
      uVar1 = TArray<InterpolationViewer,_InterpolationViewer>::Push(&PastViewers,&local_80);
      return PastViewers.Array + uVar1;
    }
    if (pIVar2->ViewActor == actor) break;
    pIVar2 = pIVar2 + 1;
    uVar3 = uVar3 - 1;
  }
  return pIVar2;
}

Assistant:

static InterpolationViewer *FindPastViewer (AActor *actor)
{
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			return &PastViewers[i];
		}
	}

	// Not found, so make a new one
	InterpolationViewer iview;
	memset(&iview, 0, sizeof(iview));
	iview.ViewActor = actor;
	iview.otic = -1;
	InterpolationPath.Clear();
	return &PastViewers[PastViewers.Push (iview)];
}